

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

void __thiscall QAccessibleLineEdit::textBeforeOffset(QAccessibleLineEdit *this)

{
  TextBoundaryType in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_R8;
  int *in_R9;
  
  textBeforeOffset((QString *)this,(QAccessibleLineEdit *)(in_RSI + -0x20),in_EDX,in_ECX,in_R8,in_R9
                  );
  return;
}

Assistant:

QString QAccessibleLineEdit::textBeforeOffset(int offset, QAccessible::TextBoundaryType boundaryType,
        int *startOffset, int *endOffset) const
{
    if (lineEdit()->echoMode() != QLineEdit::Normal) {
        *startOffset = *endOffset = -1;
        return QString();
    }
    if (offset == -2)
        offset = cursorPosition();
    return QAccessibleTextInterface::textBeforeOffset(offset, boundaryType, startOffset, endOffset);
}